

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readArray(OurReader *this,Token *token)

{
  bool bVar1;
  _Elt_pointer ppVVar2;
  byte *pbVar3;
  int iVar4;
  int index;
  Token endArray;
  Value init;
  Token currentToken;
  undefined1 local_90 [32];
  Value local_70;
  Token local_48;
  
  Value::Value(&local_70,arrayValue);
  ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar2[-1],&local_70);
  ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar2[-1],(long)token->start_ - (long)this->begin_);
  index = 0;
  do {
    pbVar3 = (byte *)this->current_;
    while (((pbVar3 != (byte *)this->end_ && ((ulong)*pbVar3 < 0x21)) &&
           ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + 1;
      this->current_ = (Location)pbVar3;
    }
    if (((this->current_ != this->end_) && (*this->current_ == 0x5d)) &&
       ((index == 0 ||
        (((this->features_).allowTrailingCommas_ == true &&
         ((this->features_).allowDroppedNullPlaceholders_ == false)))))) {
      readToken(this,(Token *)local_90);
      goto LAB_008f3ddb;
    }
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_90._0_8_ = Value::operator[](ppVVar2[-1],index);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_90);
    bVar1 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (bVar1) {
      bVar1 = readToken(this,&local_48);
      while( true ) {
        if ((bVar1 == false) || (local_48.type_ != tokenComment)) break;
        bVar1 = readToken(this,&local_48);
      }
      if (bVar1 == false) {
LAB_008f3d51:
        local_90._0_8_ = local_90 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"Missing \',\' or \']\' in array declaration","");
        addError(this,(String *)local_90,&local_48,(Location)0x0);
        recoverFromError(this,tokenArrayEnd);
        if ((Value *)local_90._0_8_ != (Value *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        iVar4 = 1;
      }
      else if (local_48.type_ == tokenArrayEnd) {
        iVar4 = 2;
      }
      else {
        if (local_48.type_ != tokenArraySeparator) goto LAB_008f3d51;
        iVar4 = 0;
      }
    }
    else {
      iVar4 = 1;
      recoverFromError(this,tokenArrayEnd);
    }
    index = index + 1;
  } while (iVar4 == 0);
  if (iVar4 == 2) {
LAB_008f3ddb:
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  Value::~Value(&local_70);
  return bVar1;
}

Assistant:

bool OurReader::readArray(Token& token) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  int index = 0;
  for (;;) {
    skipSpaces();
    if (current_ != end_ && *current_ == ']' &&
        (index == 0 ||
         (features_.allowTrailingCommas_ &&
          !features_.allowDroppedNullPlaceholders_))) // empty array or trailing
                                                      // comma
    {
      Token endArray;
      readToken(endArray);
      return true;
    }
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token currentToken;
    // Accept Comment after last item in the array.
    ok = readToken(currentToken);
    while (currentToken.type_ == tokenComment && ok) {
      ok = readToken(currentToken);
    }
    bool badTokenType = (currentToken.type_ != tokenArraySeparator &&
                         currentToken.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover("Missing ',' or ']' in array declaration",
                                currentToken, tokenArrayEnd);
    }
    if (currentToken.type_ == tokenArrayEnd)
      break;
  }
  return true;
}